

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCxxModuleMapper.cxx
# Opt level: O1

CxxBmiLocation * __thiscall
CxxModuleLocations::BmiGeneratorPathForModule
          (CxxBmiLocation *__return_storage_ptr__,CxxModuleLocations *this,string *logical_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_50;
  char local_30;
  
  if ((this->BmiLocationForModule).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*(this->BmiLocationForModule)._M_invoker)
            (__return_storage_ptr__,(_Any_data *)&this->BmiLocationForModule,logical_name);
  if (((__return_storage_ptr__->BmiLocation).
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     ((__return_storage_ptr__->BmiLocation).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length != 0)) {
    psVar3 = CxxBmiLocation::Location_abi_cxx11_(__return_storage_ptr__);
    pcVar2 = (psVar3->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + psVar3->_M_string_length);
    if ((this->PathForGenerator).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->PathForGenerator)._M_invoker)(&local_b0,(_Any_data *)&this->PathForGenerator,&local_90)
    ;
    local_50._M_value._M_string_length = local_b0._M_string_length;
    paVar1 = &local_b0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar1) {
      local_60._8_8_ = local_b0.field_2._8_8_;
      local_70._M_p = (pointer)&local_60;
    }
    else {
      local_70._M_p = local_b0._M_dataplus._M_p;
    }
    local_60._M_allocated_capacity._1_7_ = local_b0.field_2._M_allocated_capacity._1_7_;
    local_60._M_local_buf[0] = local_b0.field_2._M_local_buf[0];
    local_68 = local_b0._M_string_length;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p == &local_60) {
      local_50._24_8_ = local_60._8_8_;
      local_50._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)((long)&local_50 + 0x10);
    }
    else {
      local_50._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_70._M_p;
    }
    local_50._16_8_ = local_60._M_allocated_capacity;
    local_30 = '\x01';
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)__return_storage_ptr__,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50._M_value);
    if (local_30 == '\x01') {
      local_30 = '\0';
      if (local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50 + 0x10)) {
        operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

bool CxxModuleUsage::AddReference(std::string const& logical,
                                  std::string const& loc, LookupMethod method)
{
  auto r = this->Reference.find(logical);
  if (r != this->Reference.end()) {
    auto& ref = r->second;

    if (ref.Path == loc && ref.Method == method) {
      return true;
    }

    auto method_name = [](LookupMethod m) -> cm::static_string_view {
      switch (m) {
        case LookupMethod::ByName:
          return "by-name"_s;
        case LookupMethod::IncludeAngle:
          return "include-angle"_s;
        case LookupMethod::IncludeQuote:
          return "include-quote"_s;
      }
      assert(false && "unsupported lookup method");
      return ""_s;
    };

    cmSystemTools::Error(cmStrCat("Disagreement of the location of the '",
                                  logical,
                                  "' module. "
                                  "Location A: '",
                                  ref.Path, "' via ", method_name(ref.Method),
                                  "; "
                                  "Location B: '",
                                  loc, "' via ", method_name(method), "."));
    return false;
  }

  auto& ref = this->Reference[logical];
  ref.Path = loc;
  ref.Method = method;

  return true;
}